

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_int>,int,duckdb::BitXorOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  uint uVar1;
  uint *puVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  idx_t iVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t iVar15;
  idx_t iVar16;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if (((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) &&
       (count != 0)) {
      puVar2 = *(uint **)(input + 0x20);
      pbVar3 = (byte *)**(undefined8 **)(states + 0x20);
      bVar10 = *pbVar3;
      do {
        if ((bVar10 & 1) == 0) {
          *(uint *)(pbVar3 + 4) = *puVar2;
          *pbVar3 = 1;
          bVar10 = 1;
        }
        else {
          *(uint *)(pbVar3 + 4) = *(uint *)(pbVar3 + 4) ^ *puVar2;
        }
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (*input == (Vector)0x0 && *states == (Vector)0x0) {
    lVar4 = *(long *)(input + 0x20);
    lVar5 = *(long *)(states + 0x20);
    FlatVector::VerifyFlatVector(input);
    lVar6 = *(long *)(input + 0x28);
    if (lVar6 == 0) {
      if (count != 0) {
        iVar9 = 0;
        do {
          pcVar8 = *(char **)(lVar5 + iVar9 * 8);
          uVar1 = *(uint *)(lVar4 + iVar9 * 4);
          if (*pcVar8 == '\0') {
            *(uint *)(pcVar8 + 4) = uVar1;
            *pcVar8 = '\x01';
          }
          else {
            *(uint *)(pcVar8 + 4) = *(uint *)(pcVar8 + 4) ^ uVar1;
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar11 = 0;
      uVar12 = 0;
      do {
        uVar7 = *(ulong *)(lVar6 + uVar11 * 8);
        uVar14 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar14 = count;
        }
        uVar13 = uVar14;
        if (uVar7 != 0) {
          uVar13 = uVar12;
          if (uVar7 == 0xffffffffffffffff) {
            if (uVar12 < uVar14) {
              do {
                pcVar8 = *(char **)(lVar5 + uVar13 * 8);
                uVar1 = *(uint *)(lVar4 + uVar13 * 4);
                if (*pcVar8 == '\0') {
                  *(uint *)(pcVar8 + 4) = uVar1;
                  *pcVar8 = '\x01';
                }
                else {
                  *(uint *)(pcVar8 + 4) = *(uint *)(pcVar8 + 4) ^ uVar1;
                }
                uVar13 = uVar13 + 1;
              } while (uVar14 != uVar13);
            }
          }
          else if (uVar12 < uVar14) {
            uVar13 = 0;
            do {
              if ((uVar7 >> (uVar13 & 0x3f) & 1) != 0) {
                pcVar8 = *(char **)(lVar5 + uVar12 * 8 + uVar13 * 8);
                uVar1 = *(uint *)(lVar4 + uVar12 * 4 + uVar13 * 4);
                if (*pcVar8 == '\0') {
                  *(uint *)(pcVar8 + 4) = uVar1;
                  *pcVar8 = '\x01';
                }
                else {
                  *(uint *)(pcVar8 + 4) = *(uint *)(pcVar8 + 4) ^ uVar1;
                }
              }
              uVar13 = uVar13 + 1;
            } while ((uVar12 - uVar14) + uVar13 != 0);
            uVar13 = uVar12 + uVar13;
          }
        }
        uVar11 = uVar11 + 1;
        uVar12 = uVar13;
      } while (uVar11 != count + 0x3f >> 6);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
    if (local_a8 == 0) {
      if (count != 0) {
        lVar4 = *local_b8;
        lVar5 = *local_70;
        iVar9 = 0;
        do {
          iVar15 = iVar9;
          if (lVar4 != 0) {
            iVar15 = (idx_t)*(uint *)(lVar4 + iVar9 * 4);
          }
          iVar16 = iVar9;
          if (lVar5 != 0) {
            iVar16 = (idx_t)*(uint *)(lVar5 + iVar9 * 4);
          }
          pcVar8 = *(char **)(local_68 + iVar16 * 8);
          uVar1 = *(uint *)(local_b0 + iVar15 * 4);
          if (*pcVar8 == '\0') {
            *(uint *)(pcVar8 + 4) = uVar1;
            *pcVar8 = '\x01';
          }
          else {
            *(uint *)(pcVar8 + 4) = *(uint *)(pcVar8 + 4) ^ uVar1;
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      lVar4 = *local_b8;
      lVar5 = *local_70;
      iVar9 = 0;
      do {
        iVar15 = iVar9;
        if (lVar4 != 0) {
          iVar15 = (idx_t)*(uint *)(lVar4 + iVar9 * 4);
        }
        iVar16 = iVar9;
        if (lVar5 != 0) {
          iVar16 = (idx_t)*(uint *)(lVar5 + iVar9 * 4);
        }
        if ((*(ulong *)(local_a8 + (iVar15 >> 6) * 8) >> (iVar15 & 0x3f) & 1) != 0) {
          pcVar8 = *(char **)(local_68 + iVar16 * 8);
          uVar1 = *(uint *)(local_b0 + iVar15 * 4);
          if (*pcVar8 == '\0') {
            *(uint *)(pcVar8 + 4) = uVar1;
            *pcVar8 = '\x01';
          }
          else {
            *(uint *)(pcVar8 + 4) = *(uint *)(pcVar8 + 4) ^ uVar1;
          }
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}